

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_streaminfo
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_streaminfo *pStreamInfo)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  long lVar6;
  ushort *in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  ma_uint8 md5 [16];
  ma_uint64 importantProps;
  ma_uint64 frameSizes;
  ma_uint32 blockSizes;
  undefined8 local_88;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  int local_64;
  ushort *local_60;
  undefined8 local_58;
  code *local_50;
  ma_bool32 local_44;
  
  local_70 = 0;
  local_60 = in_RDX;
  local_58 = in_RSI;
  local_50 = in_RDI;
  lVar6 = (*in_RDI)(in_RSI,&local_64,4);
  if (lVar6 == 4) {
    lVar6 = (*local_50)(local_58,&local_70,6);
    if (lVar6 == 6) {
      lVar6 = (*local_50)(local_58,&local_78,8);
      if (lVar6 == 8) {
        lVar6 = (*local_50)(local_58,&local_88,0x10);
        if (lVar6 == 0x10) {
          uVar5 = (ushort)((uint)local_64 >> 8);
          uVar1 = (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
                  (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18;
          uVar3 = (local_78 & 0xff000000) << 8;
          uVar4 = (local_78 & 0xff0000) << 0x18;
          uVar2 = uVar3 | uVar4;
          *local_60 = uVar5 & 0xff | (ushort)((uint)(local_64 << 0x18) >> 0x10);
          local_60[1] = (ushort)(byte)((uint)local_64 >> 0x18) | uVar5 & 0xff00;
          *(uint *)(local_60 + 2) =
               ((uint)(uVar1 >> 0x20) | (uint)(((local_70 & 0xff00) << 0x28) >> 0x20) |
               (uint)((local_70 << 0x38) >> 0x20)) >> 8;
          *(uint *)(local_60 + 4) = (uint)(uVar1 >> 0x10) & 0xffffff;
          *(uint *)(local_60 + 6) =
               ((uint)(uVar2 >> 0x20) | (uint)(((local_78 & 0xff00) << 0x28) >> 0x20) |
               (uint)((local_78 << 0x38) >> 0x20)) >> 0xc;
          *(char *)(local_60 + 8) = (char)((uVar4 & 0xe0000000000) >> 0x29) + '\x01';
          *(char *)((long)local_60 + 0x11) = (char)((uVar2 & 0x1f000000000) >> 0x24) + '\x01';
          *(ulong *)(local_60 + 0xc) =
               local_78 >> 0x38 | (local_78 & 0xff000000000000) >> 0x28 |
               (local_78 & 0xff0000000000) >> 0x18 | (local_78 & 0xff00000000) >> 8 |
               uVar3 & 0xfffffffff;
          *(undefined8 *)(local_60 + 0x10) = local_88;
          *(undefined8 *)(local_60 + 0x14) = local_80;
          local_44 = 1;
        }
        else {
          local_44 = 0;
        }
      }
      else {
        local_44 = 0;
      }
    }
    else {
      local_44 = 0;
    }
  }
  else {
    local_44 = 0;
  }
  return local_44;
}

Assistant:

static ma_bool32 ma_dr_flac__read_streaminfo(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_streaminfo* pStreamInfo)
{
    ma_uint32 blockSizes;
    ma_uint64 frameSizes = 0;
    ma_uint64 importantProps;
    ma_uint8 md5[16];
    if (onRead(pUserData, &blockSizes, 4) != 4) {
        return MA_FALSE;
    }
    if (onRead(pUserData, &frameSizes, 6) != 6) {
        return MA_FALSE;
    }
    if (onRead(pUserData, &importantProps, 8) != 8) {
        return MA_FALSE;
    }
    if (onRead(pUserData, md5, sizeof(md5)) != sizeof(md5)) {
        return MA_FALSE;
    }
    blockSizes     = ma_dr_flac__be2host_32(blockSizes);
    frameSizes     = ma_dr_flac__be2host_64(frameSizes);
    importantProps = ma_dr_flac__be2host_64(importantProps);
    pStreamInfo->minBlockSizeInPCMFrames = (ma_uint16)((blockSizes & 0xFFFF0000) >> 16);
    pStreamInfo->maxBlockSizeInPCMFrames = (ma_uint16) (blockSizes & 0x0000FFFF);
    pStreamInfo->minFrameSizeInPCMFrames = (ma_uint32)((frameSizes     &  (((ma_uint64)0x00FFFFFF << 16) << 24)) >> 40);
    pStreamInfo->maxFrameSizeInPCMFrames = (ma_uint32)((frameSizes     &  (((ma_uint64)0x00FFFFFF << 16) <<  0)) >> 16);
    pStreamInfo->sampleRate              = (ma_uint32)((importantProps &  (((ma_uint64)0x000FFFFF << 16) << 28)) >> 44);
    pStreamInfo->channels                = (ma_uint8 )((importantProps &  (((ma_uint64)0x0000000E << 16) << 24)) >> 41) + 1;
    pStreamInfo->bitsPerSample           = (ma_uint8 )((importantProps &  (((ma_uint64)0x0000001F << 16) << 20)) >> 36) + 1;
    pStreamInfo->totalPCMFrameCount      =                ((importantProps & ((((ma_uint64)0x0000000F << 16) << 16) | 0xFFFFFFFF)));
    MA_DR_FLAC_COPY_MEMORY(pStreamInfo->md5, md5, sizeof(md5));
    return MA_TRUE;
}